

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

VaryingInterpolation deqp::gles31::Functional::anon_unknown_0::randomInterpolation(Random *rnd)

{
  int iVar1;
  Random *rnd_local;
  
  iVar1 = de::Random::getInt(rnd,0,3);
  return randomInterpolation::s_validInterpolations[iVar1];
}

Assistant:

VaryingInterpolation randomInterpolation (Random& rnd)
{
	static const VaryingInterpolation s_validInterpolations[] =
	{
		VARYINGINTERPOLATION_SMOOTH,
		VARYINGINTERPOLATION_FLAT,
		VARYINGINTERPOLATION_CENTROID,
		VARYINGINTERPOLATION_DEFAULT,
	};
	return s_validInterpolations[rnd.getInt(0, DE_LENGTH_OF_ARRAY(s_validInterpolations)-1)];
}